

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_readDTableX1_wksp_bmi2
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int bmi2)

{
  undefined1 uVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  undefined1 uVar16;
  uint uVar17;
  size_t sVar18;
  U32 nbSymbols;
  U32 tableLog;
  
  tableLog = 0;
  nbSymbols = 0;
  sVar18 = 0xffffffffffffffd4;
  if ((0x5e7 < wkspSize) &&
     (sVar3 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x4e8),0x100,(U32 *)workSpace,&nbSymbols
                                 ,&tableLog,src,srcSize,(void *)((long)workSpace + 0x80),0x368,bmi2)
     , sVar18 = sVar3, sVar3 < 0xffffffffffffff89)) {
    uVar2 = *DTable;
    sVar18 = 0xffffffffffffffd4;
    if (tableLog <= (uVar2 & 0xff) + 1) {
      *(char *)DTable = (char)uVar2;
      *(undefined1 *)((long)DTable + 1) = 0;
      *(char *)((long)DTable + 2) = (char)tableLog;
      *(char *)((long)DTable + 3) = (char)(uVar2 >> 0x18);
      lVar13 = (ulong)tableLog + 1;
      iVar6 = 0;
      for (lVar4 = 0; lVar13 != lVar4; lVar4 = lVar4 + 1) {
        iVar12 = *(int *)((long)workSpace + lVar4 * 4);
        *(int *)((long)workSpace + lVar4 * 4 + 0x40) = iVar6;
        iVar6 = iVar12 + iVar6;
      }
      for (lVar4 = 0; lVar8 = lVar4, lVar11 = 4, lVar4 < (long)(int)nbSymbols + -3;
          lVar4 = lVar4 + 4) {
        while (lVar11 != 0) {
          uVar5 = (ulong)*(byte *)((long)workSpace + lVar8 + 0x4e8);
          uVar2 = *(uint *)((long)workSpace + uVar5 * 4 + 0x40);
          *(uint *)((long)workSpace + uVar5 * 4 + 0x40) = uVar2 + 1;
          *(char *)((long)workSpace + (ulong)uVar2 + 1000) = (char)lVar8;
          lVar8 = lVar8 + 1;
          lVar11 = lVar11 + -1;
        }
      }
      for (; lVar4 < (int)nbSymbols; lVar4 = lVar4 + 1) {
        uVar5 = (ulong)*(byte *)((long)workSpace + lVar4 + 0x4e8);
        uVar2 = *(uint *)((long)workSpace + uVar5 * 4 + 0x40);
        *(uint *)((long)workSpace + uVar5 * 4 + 0x40) = uVar2 + 1;
        *(char *)((long)workSpace + (ulong)uVar2 + 1000) = (char)lVar4;
      }
      iVar6 = *workSpace;
      iVar12 = 0;
      for (lVar4 = 1; sVar18 = sVar3, lVar4 != lVar13; lVar4 = lVar4 + 1) {
        uVar2 = *(uint *)((long)workSpace + lVar4 * 4);
        iVar10 = (1 << ((byte)lVar4 & 0x1f)) >> 1;
        uVar17 = (int)lVar13 - (int)lVar4;
        lVar8 = (long)iVar12;
        lVar11 = (long)iVar6;
        uVar16 = (undefined1)uVar17;
        switch(iVar10) {
        case 1:
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = (ulong)uVar2;
          }
          for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
            *(undefined1 *)((long)DTable + uVar14 * 2 + lVar8 * 2 + 4) =
                 *(undefined1 *)((long)workSpace + uVar14 + lVar11 + 1000);
            *(undefined1 *)((long)DTable + uVar14 * 2 + lVar8 * 2 + 5) = uVar16;
          }
          break;
        case 2:
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = (ulong)uVar2;
          }
          lVar8 = lVar8 * 2;
          for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
            uVar1 = *(undefined1 *)((long)workSpace + uVar14 + lVar11 + 1000);
            *(undefined1 *)((long)DTable + uVar14 * 4 + lVar8 + 4) = uVar1;
            *(undefined1 *)((long)DTable + uVar14 * 4 + lVar8 + 5) = uVar16;
            *(undefined1 *)((long)DTable + uVar14 * 4 + lVar8 + 6) = uVar1;
            *(undefined1 *)((long)DTable + uVar14 * 4 + lVar8 + 7) = uVar16;
          }
          break;
        default:
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = (ulong)uVar2;
          }
          lVar8 = (long)DTable + lVar8 * 2 + 0x1c;
          for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
            lVar7 = (ulong)((uint)*(byte *)((long)workSpace + lVar11 + uVar14 + 1000) |
                           (uVar17 & 0xff) << 8) * 0x1000100010001;
            for (lVar9 = 0; lVar9 < iVar10; lVar9 = lVar9 + 0x10) {
              *(long *)(lVar8 + -0x18 + lVar9 * 2) = lVar7;
              *(long *)(lVar8 + -0x10 + lVar9 * 2) = lVar7;
              *(long *)(lVar8 + -8 + lVar9 * 2) = lVar7;
              *(long *)(lVar8 + lVar9 * 2) = lVar7;
            }
            lVar8 = lVar8 + (long)iVar10 * 2;
          }
          break;
        case 4:
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = (ulong)uVar2;
          }
          for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
            *(ulong *)((long)DTable + uVar14 * 8 + lVar8 * 2 + 4) =
                 (ulong)((uint)*(byte *)((long)workSpace + uVar14 + lVar11 + 1000) |
                        (uVar17 & 0xff) << 8) * 0x1000100010001;
          }
          break;
        case 8:
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = (ulong)uVar2;
          }
          plVar15 = (long *)((long)DTable + lVar8 * 2 + 0xc);
          for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
            lVar8 = (ulong)((uint)*(byte *)((long)workSpace + uVar14 + lVar11 + 1000) |
                           uVar17 * 0x100 & 0xffff) * 0x1000100010001;
            plVar15[-1] = lVar8;
            *plVar15 = lVar8;
            plVar15 = plVar15 + 2;
          }
        }
        iVar6 = iVar6 + uVar2;
        iVar12 = iVar12 + iVar10 * uVar2;
      }
    }
  }
  return sVar18;
}

Assistant:

size_t HUF_readDTableX1_wksp_bmi2(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int bmi2)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), bmi2);
    if (HUF_isError(iSize)) return iSize;

    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {
        int n;
        int nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outter loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {
        U32 w;
        int symbol=wksp->rankVal[0];
        int rankStart=0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}